

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver3.c
# Opt level: O2

void sat_solver3_set_var_activity(sat_solver3 *s,int *pVars,int nVars)

{
  ulong uVar1;
  int v;
  ulong uVar2;
  
  if (s->VarActType == 1) {
    uVar1 = 0;
    uVar2 = (ulong)(uint)s->size;
    if (s->size < 1) {
      uVar2 = uVar1;
    }
    for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
      s->activity[uVar1] = 0;
    }
    s->var_inc = 0x3ff0000000000000;
    uVar2 = 0;
    uVar1 = 0;
    if (0 < nVars) {
      uVar1 = (ulong)(uint)nVars;
    }
    for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
      if (pVars == (int *)0x0) {
        v = (int)uVar2;
      }
      else {
        v = pVars[uVar2];
      }
      s->activity[v] = (word)(double)nVars;
      order_update(s,v);
      nVars = nVars + -1;
    }
    return;
  }
  __assert_fail("s->VarActType == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver3.c"
                ,0xdb,"void sat_solver3_set_var_activity(sat_solver3 *, int *, int)");
}

Assistant:

void sat_solver3_set_var_activity(sat_solver3* s, int * pVars, int nVars) 
{
    int i;
    assert( s->VarActType == 1 );
    for (i = 0; i < s->size; i++)
        s->activity[i] = 0;
    s->var_inc = Abc_Dbl2Word(1);
    for ( i = 0; i < nVars; i++ )
    {
        int iVar = pVars ? pVars[i] : i;
        s->activity[iVar] = Abc_Dbl2Word(nVars-i);
        order_update( s, iVar );
    }
}